

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NetTypeDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetTypeDeclarationSyntax,slang::syntax::NetTypeDeclarationSyntax_const&>
          (BumpAllocator *this,NetTypeDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  DataTypeSyntax *pDVar4;
  Info *pIVar5;
  WithFunctionClauseSyntax *pWVar6;
  Info *pIVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  NetTypeDeclarationSyntax *pNVar20;
  
  pNVar20 = (NetTypeDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NetTypeDeclarationSyntax *)this->endPtr < pNVar20 + 1) {
    pNVar20 = (NetTypeDeclarationSyntax *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(pNVar20 + 1);
  }
  (pNVar20->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar8 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pNVar20->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar20->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar8;
  (pNVar20->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar8 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pNVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pNVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar8
  ;
  (pNVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pNVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pNVar20->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0062ede0;
  (pNVar20->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pNVar20->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pNVar20->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pNVar20->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0062f0b8;
  uVar9 = (args->keyword).field_0x2;
  NVar10.raw = (args->keyword).numFlags.raw;
  uVar11 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  pDVar4 = (args->type).ptr;
  TVar12 = (args->name).kind;
  uVar13 = (args->name).field_0x2;
  NVar14.raw = (args->name).numFlags.raw;
  uVar15 = (args->name).rawLen;
  pIVar5 = (args->name).info;
  pWVar6 = args->withFunction;
  TVar16 = (args->semi).kind;
  uVar17 = (args->semi).field_0x2;
  NVar18.raw = (args->semi).numFlags.raw;
  uVar19 = (args->semi).rawLen;
  pIVar7 = (args->semi).info;
  (pNVar20->keyword).kind = (args->keyword).kind;
  (pNVar20->keyword).field_0x2 = uVar9;
  (pNVar20->keyword).numFlags = (NumericTokenFlags)NVar10.raw;
  (pNVar20->keyword).rawLen = uVar11;
  (pNVar20->keyword).info = pIVar3;
  (pNVar20->type).ptr = pDVar4;
  (pNVar20->name).kind = TVar12;
  (pNVar20->name).field_0x2 = uVar13;
  (pNVar20->name).numFlags = (NumericTokenFlags)NVar14.raw;
  (pNVar20->name).rawLen = uVar15;
  (pNVar20->name).info = pIVar5;
  pNVar20->withFunction = pWVar6;
  (pNVar20->semi).kind = TVar16;
  (pNVar20->semi).field_0x2 = uVar17;
  (pNVar20->semi).numFlags = (NumericTokenFlags)NVar18.raw;
  (pNVar20->semi).rawLen = uVar19;
  (pNVar20->semi).info = pIVar7;
  return pNVar20;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }